

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cc
# Opt level: O1

void print_usage_and_exit(int exit_code)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,"ripser ");
  poVar1 = std::operator<<(poVar1,"[options] [filename]");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Options:");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  --help           print this screen");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "  --format         use the specified file format for the input. Options are:"
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "                     lower-distance (lower triangular distance matrix)")
  ;
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "                     upper-distance (upper triangular distance matrix)")
  ;
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "         (default:)  distance       (distance matrix; only lower triangular part is read)"
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "                     point-cloud    (point cloud in Euclidean space)");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "                     dipha          (distance matrix in DIPHA file format)"
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "                     sparse         (sparse distance matrix in sparse triplet format)"
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "                     binary         (lower triangular distance matrix in binary format)"
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  --dim <k>        compute persistent homology up to dimension k"
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  --threshold <t>  compute Rips complexes up to diameter t");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "  --modulus <p>    compute homology with coefficients in the prime field Z/pZ"
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "  --ratio <r>      only show persistence pairs with death/birth ratio > r"
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(exit_code);
}

Assistant:

void print_usage_and_exit(int exit_code) {
  std::cerr
    << "Usage: "
    << "ripser "
    << "[options] [filename]" << std::endl
    << std::endl
    << "Options:" << std::endl
    << std::endl
    << "  --help           print this screen" << std::endl
    << "  --format         use the specified file format for the input. Options are:"
    << std::endl
    << "                     lower-distance (lower triangular distance matrix)"
    << std::endl
    << "                     upper-distance (upper triangular distance matrix)" << std::endl
    << "         (default:)  distance       (distance matrix; only lower triangular part is read)" << std::endl
    << "                     point-cloud    (point cloud in Euclidean space)" << std::endl
    << "                     dipha          (distance matrix in DIPHA file format)" << std::endl
    << "                     sparse         (sparse distance matrix in sparse triplet format)"
    << std::endl
    << "                     binary         (lower triangular distance matrix in binary format)"
    << std::endl
    << "  --dim <k>        compute persistent homology up to dimension k" << std::endl
    << "  --threshold <t>  compute Rips complexes up to diameter t" << std::endl
    << "  --modulus <p>    compute homology with coefficients in the prime field Z/pZ"
    << std::endl
    << "  --ratio <r>      only show persistence pairs with death/birth ratio > r" << std::endl
    << std::endl;
  exit(exit_code);
}